

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void __thiscall
HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator>::
Or<ObjWriteGuardBucket(*)(ObjWriteGuardBucket,ObjWriteGuardBucket)>
          (HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjWriteGuardBucket_ObjWriteGuardBucket_ObjWriteGuardBucket *fn)

{
  int iVar1;
  SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  NodeBase *pNVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  ObjWriteGuardBucket OVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 local_68 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  if (*(int *)(this + 8) != 0) {
    pNVar6 = (NodeBase *)__tls_get_addr(&PTR_0155fe48);
    uVar11 = 0;
    iter.last = pNVar6;
    do {
      local_40 = (undefined1  [8])(this2->table + uVar11);
      iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   local_40;
      if (local_40 == (undefined1  [8])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)&pNVar6->next = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
LAB_003f203b:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *(undefined4 *)&pNVar6->next = 0;
      }
      pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
      local_68 = (undefined1  [8])(uVar11 * 0x10 + *(long *)(this + 0x10));
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)local_68;
      do {
        bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_68);
        if (!bVar4) break;
        pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_68);
        if ((iter2.list !=
             (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           ((undefined1  [8])iter2.list != local_40)) {
          while (iVar1 = pTVar7->value,
                pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                         Iterator::Data((Iterator *)local_40), iVar1 < pTVar8->value) {
            pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::InsertNodeBefore
                               ((EditingIterator *)local_68,*(ArenaAllocator **)this);
            pTVar9 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            pTVar8->value = pTVar9->value;
            pTVar9 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            OVar10 = (*fn)((ObjWriteGuardBucket)0x0,(pTVar9->element).writeGuards);
            (pTVar8->element).writeGuards = OVar10.writeGuards;
            if (iter2.list ==
                (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pNVar6 = iter.last;
              *(undefined4 *)&(iter.last)->next = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar4) goto LAB_003f203b;
              *(undefined4 *)&pNVar6->next = 0;
            }
            pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
            if ((undefined1  [8])pSVar2 != local_40) {
              iter2.list = pSVar2;
            }
            if ((iter2.list ==
                 (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
               || ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        bVar4 = iter2.list !=
                (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
        bVar12 = (undefined1  [8])iter2.list != local_40;
        if (!bVar12 || !bVar4) break;
        iVar1 = pTVar7->value;
        pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_40);
        if (iVar1 == pTVar8->value) {
          OVar10.writeGuards = (pTVar7->element).writeGuards;
          pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          OVar10 = (*fn)(OVar10,(pTVar8->element).writeGuards);
          (pTVar7->element).writeGuards = OVar10.writeGuards;
          if (iter2.list ==
              (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar6 = iter.last;
            *(undefined4 *)&(iter.last)->next = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_003f203b;
            *(undefined4 *)&pNVar6->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        }
      } while (bVar12 && bVar4);
      pNVar6 = iter.last;
      if ((iter2.list !=
           (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         ((undefined1  [8])iter2.list != local_40)) {
        do {
          pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::InsertNodeBefore
                             ((EditingIterator *)local_68,*(ArenaAllocator **)this);
          pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          pTVar7->value = pTVar8->value;
          pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          OVar10 = (*fn)((ObjWriteGuardBucket)0x0,(pTVar8->element).writeGuards);
          (pTVar7->element).writeGuards = OVar10.writeGuards;
          if (iter2.list ==
              (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pNVar6->next = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003f203b;
            *(undefined4 *)&pNVar6->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        } while ((iter2.list !=
                  (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
                && ((undefined1  [8])iter2.list != local_40));
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < *(uint *)(this + 8));
  }
  return;
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }